

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::iterate
          (TextureBorderClampTest *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  TestLog *log;
  undefined1 local_20c [8];
  ReferenceParams samplerParams;
  Surface renderedFrame;
  string local_158;
  ScopedLogSection local_138;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  int local_f4;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string iterationDesc;
  IterationConfig iterationConfig;
  TextureBorderClampTest *this_local;
  
  iterationConfig._112_8_ = this;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            ((undefined1 *)((long)&iterationDesc.field_2 + 8),this,(ulong)(uint)this->m_iterationNdx
            );
  local_f4 = this->m_iterationNdx + 1;
  de::toString<int>(&local_f0,&local_f4);
  std::operator+(&local_d0,"Iteration ",&local_f0);
  uVar3 = std::__cxx11::string::empty();
  section.m_log._6_1_ = 0;
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_128," - ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &iterationConfig.minFilter);
  }
  else {
    std::allocator<char>::allocator();
    section.m_log._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"",(allocator<char> *)((long)&section.m_log + 7));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_d0,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  if ((section.m_log._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
  }
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Iteration",
             (allocator<char> *)((long)&renderedFrame.m_pixels.m_cap + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_138,log,&local_158,(string *)local_b0);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&renderedFrame.m_pixels.m_cap + 7));
  tcu::Surface::Surface((Surface *)&samplerParams.baseLevel,0x80,0x80);
  genSamplerParams((ReferenceParams *)local_20c,this,
                   (IterationConfig *)((long)&iterationDesc.field_2 + 8));
  logParams(this,(IterationConfig *)((long)&iterationDesc.field_2 + 8),(ReferenceParams *)local_20c)
  ;
  renderTo(this,(Surface *)&samplerParams.baseLevel,
           (IterationConfig *)((long)&iterationDesc.field_2 + 8),(ReferenceParams *)local_20c);
  verifyImage(this,(Surface *)&samplerParams.baseLevel,
              (IterationConfig *)((long)&iterationDesc.field_2 + 8),(ReferenceParams *)local_20c);
  iVar1 = this->m_iterationNdx + 1;
  this->m_iterationNdx = iVar1;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  if (iVar1 == iVar2) {
    tcu::ResultCollector::setTestContextResult
              (&this->m_result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  }
  this_local._4_4_ = (IterateResult)(iVar1 != iVar2);
  tcu::Surface::~Surface((Surface *)&samplerParams.baseLevel);
  tcu::ScopedLogSection::~ScopedLogSection(&local_138);
  std::__cxx11::string::~string((string *)local_b0);
  IterationConfig::~IterationConfig((IterationConfig *)((long)&iterationDesc.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

TextureBorderClampTest::IterateResult TextureBorderClampTest::iterate (void)
{
	const IterationConfig						iterationConfig		= getIteration(m_iterationNdx);
	const std::string							iterationDesc		= "Iteration " + de::toString(m_iterationNdx+1) + (iterationConfig.description.empty() ? ("") : (" - " + iterationConfig.description));
	const tcu::ScopedLogSection					section				(m_testCtx.getLog(), "Iteration", iterationDesc);
	tcu::Surface								renderedFrame		(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const glu::TextureTestUtil::ReferenceParams	samplerParams		= genSamplerParams(iterationConfig);

	logParams(iterationConfig, samplerParams);
	renderTo(renderedFrame, iterationConfig, samplerParams);
	verifyImage(renderedFrame, iterationConfig, samplerParams);

	if (++m_iterationNdx == getNumIterations())
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	return CONTINUE;
}